

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::_::RawSchema_*> * __thiscall
kj::ArrayBuilder<capnp::_::RawSchema_*>::operator=
          (ArrayBuilder<capnp::_::RawSchema_*> *this,ArrayBuilder<capnp::_::RawSchema_*> *other)

{
  RemoveConst<capnp::_::RawSchema_*> *ppRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  ppRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = ppRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (RawSchema **)0x0;
  other->pos = (RemoveConst<capnp::_::RawSchema_*> *)0x0;
  other->endPtr = (RawSchema **)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }